

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

ScatterOut * __thiscall
cert::Dielectric::scatter
          (ScatterOut *__return_storage_ptr__,Dielectric *this,Vec3 point,Vec3 normal,UV uv,
          Ray *r_in,PRNG *random)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  float fVar7;
  undefined4 uVar8;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float ni_over_nt;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar17;
  float fVar18;
  RefractDataOut RVar19;
  float local_78;
  Vec3 local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  
  local_58.z = normal.z;
  local_58._0_8_ = normal._0_8_;
  fVar9 = point.z;
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = point._0_8_;
  local_28._12_4_ = in_XMM0_Dd;
  fVar17 = (r_in->direction).z;
  uVar1 = (r_in->direction).x;
  uVar2 = (r_in->direction).y;
  fVar18 = fVar17 * local_58.z + (float)uVar1 * normal.x + (float)uVar2 * normal.y;
  fVar7 = fVar18 + fVar18;
  fVar10 = fVar7 * normal.x;
  fVar14 = fVar7 * normal.y;
  fVar15 = fVar7 * in_XMM2_Dc;
  fVar16 = fVar7 * in_XMM2_Dd;
  fVar7 = fVar7 * local_58.z;
  if (fVar18 <= 0.0) {
    local_78 = 0.0;
    ni_over_nt = 1.0 / *(float *)&(this->super_Material).field_0x14;
  }
  else {
    local_48 = ZEXT416((uint)fVar7);
    local_38._4_4_ = fVar14;
    local_38._0_4_ = fVar10;
    fStack_30 = fVar15;
    fStack_2c = fVar16;
    local_58._0_8_ = local_58._0_8_ ^ 0x8000000080000000;
    local_58.z = -local_58.z;
    ni_over_nt = *(float *)&(this->super_Material).field_0x14;
    dVar5 = sqrt((double)(ulong)(uint)(fVar17 * fVar17 +
                                      (float)uVar1 * (float)uVar1 + (float)uVar2 * (float)uVar2));
    local_78 = (fVar18 * ni_over_nt) / SUB84(dVar5,0);
    fVar7 = (float)local_48._0_4_;
    fVar10 = (float)local_38._0_4_;
    fVar14 = (float)local_38._4_4_;
    fVar15 = fStack_30;
    fVar16 = fStack_2c;
  }
  fVar10 = (float)uVar1 - fVar10;
  fVar14 = (float)uVar2 - fVar14;
  fVar17 = fVar17 - fVar7;
  RVar19 = refract_func(&r_in->direction,&local_58,ni_over_nt);
  auVar13 = local_28;
  local_28 = auVar13;
  if (((undefined1  [16])RVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __return_storage_ptr__->is_scattered = true;
    (__return_storage_ptr__->attenuation).x = 1.0;
    (__return_storage_ptr__->attenuation).y = 1.0;
    (__return_storage_ptr__->attenuation).z = 1.0;
    (__return_storage_ptr__->scattered).origin.x = (float)local_28._0_4_;
    (__return_storage_ptr__->scattered).origin.y = (float)local_28._4_4_;
    (__return_storage_ptr__->scattered).origin.z = fVar9;
    dVar5 = sqrt((double)(ulong)(uint)(fVar17 * fVar17 + fVar10 * fVar10 + fVar14 * fVar14));
    fVar7 = SUB84(dVar5,0);
    uVar8 = (undefined4)((ulong)dVar5 >> 0x20);
    auVar12._4_4_ = fVar14;
    auVar12._0_4_ = fVar10;
    auVar12._8_4_ = 0.0 - fVar15;
    auVar12._12_4_ = 0.0 - fVar16;
    auVar13._4_4_ = fVar7;
    auVar13._0_4_ = fVar7;
    auVar13._8_4_ = uVar8;
    auVar13._12_4_ = uVar8;
    auVar13 = divps(auVar12,auVar13);
    (__return_storage_ptr__->scattered).direction.x = (float)(int)auVar13._0_8_;
    (__return_storage_ptr__->scattered).direction.y = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
    (__return_storage_ptr__->scattered).direction.z = fVar17 / fVar7;
    __return_storage_ptr__->index = 0.0;
    (__return_storage_ptr__->refracted).origin.x = 0.0;
    (__return_storage_ptr__->refracted).origin.y = 0.0;
    (__return_storage_ptr__->refracted).origin.z = 0.0;
    dVar5 = sqrt(5.26354424712089e-315);
    fVar7 = 1.0 / SUB84(dVar5,0);
    fVar17 = 0.0 / SUB84(dVar5,0);
    uVar11 = CONCAT44(fVar17,fVar17);
  }
  else {
    _local_38 = ZEXT416((uint)RVar19.refracted.x);
    fVar7 = *(float *)&(this->super_Material).field_0x14;
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = RVar19.refracted._4_8_;
    local_48._12_4_ = extraout_XMM0_Dd;
    local_78 = 1.0 - local_78;
    fVar18 = (1.0 - fVar7) / (fVar7 + 1.0);
    fVar18 = fVar18 * fVar18;
    __return_storage_ptr__->is_scattered = true;
    (__return_storage_ptr__->attenuation).x = 1.0;
    (__return_storage_ptr__->attenuation).y = 1.0;
    (__return_storage_ptr__->attenuation).z = 1.0;
    (__return_storage_ptr__->scattered).origin.x = (float)local_28._0_4_;
    (__return_storage_ptr__->scattered).origin.y = (float)local_28._4_4_;
    (__return_storage_ptr__->scattered).origin.z = fVar9;
    dVar5 = sqrt((double)(ulong)(uint)(fVar17 * fVar17 + fVar10 * fVar10 + fVar14 * fVar14));
    auVar13 = local_28;
    fVar7 = SUB84(dVar5,0);
    uVar8 = (undefined4)((ulong)dVar5 >> 0x20);
    auVar6._4_4_ = fVar14;
    auVar6._0_4_ = fVar10;
    auVar6._8_4_ = 0.0 - fVar15;
    auVar6._12_4_ = 0.0 - fVar16;
    auVar3._4_4_ = fVar7;
    auVar3._0_4_ = fVar7;
    auVar3._8_4_ = uVar8;
    auVar3._12_4_ = uVar8;
    auVar12 = divps(auVar6,auVar3);
    (__return_storage_ptr__->scattered).direction.x = (float)(int)auVar12._0_8_;
    (__return_storage_ptr__->scattered).direction.y = (float)(int)((ulong)auVar12._0_8_ >> 0x20);
    (__return_storage_ptr__->scattered).direction.z = fVar17 / fVar7;
    __return_storage_ptr__->index =
         local_78 * local_78 * local_78 * local_78 * local_78 * (1.0 - fVar18) + fVar18;
    (__return_storage_ptr__->refracted).origin.x = (float)local_28._0_4_;
    (__return_storage_ptr__->refracted).origin.y = (float)local_28._4_4_;
    (__return_storage_ptr__->refracted).origin.z = fVar9;
    local_28 = auVar13;
    dVar5 = sqrt((double)CONCAT44(local_48._4_4_,
                                  (float)local_48._4_4_ * (float)local_48._4_4_ +
                                  (float)local_38._0_4_ * (float)local_38._0_4_ +
                                  (float)local_48._0_4_ * (float)local_48._0_4_));
    fVar17 = SUB84(dVar5,0);
    fVar7 = (float)local_38._0_4_ / fVar17;
    auVar4._4_4_ = fVar17;
    auVar4._0_4_ = fVar17;
    auVar4._8_4_ = fVar17;
    auVar4._12_4_ = fVar17;
    auVar13 = divps(local_48,auVar4);
    uVar11 = auVar13._0_8_;
  }
  (__return_storage_ptr__->refracted).direction.x = fVar7;
  (__return_storage_ptr__->refracted).direction.y = (float)(int)uVar11;
  (__return_storage_ptr__->refracted).direction.z = (float)((ulong)uVar11 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

constexpr virtual ScatterOut scatter (Vec3 point, Vec3 normal, UV uv, const Ray& r_in, PRNG& random) const
	{
		Vec3 outward_normal;
		Vec3 reflected = reflect (r_in.direction, normal);
		float ni_over_nt = 0;
		float reflect_prob = 0;
		float cosine = 0;

		if (dot (r_in.direction, normal) > 0)
		{
			outward_normal = -normal;
			ni_over_nt = ref_idx;
			cosine = ref_idx * dot (r_in.direction, normal) / r_in.direction.length ();
		}
		else
		{
			outward_normal = normal;
			ni_over_nt = 1.0 / ref_idx;
		}
		RefractDataOut refracted = refract_func (r_in.direction, outward_normal, ni_over_nt);
		if (refracted.is_refracted)
		{
			reflect_prob = schlick (cosine, ref_idx);
			return { true,
				Vec3 (1.0, 1.0, 1.0),
				Ray (point, reflected),
				reflect_prob,
				Ray (point, refracted.refracted) };
		}
		else
		{
			return { true, Vec3 (1.0, 1.0, 1.0), Ray (point, reflected), 0.0 };
		}
	}